

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialRuntimeObjects.cpp
# Opt level: O2

void __thiscall Lodtalk::SpecialRuntimeObjects::initialize(SpecialRuntimeObjects *this)

{
  WithoutGC wgc;
  WithoutGC local_10;
  
  local_10.context = this->context;
  VMContext::disableGC(local_10.context);
  createSpecialObjectTable(this);
  createSpecialClassTable(this);
  registerGCRoots(this);
  WithoutGC::~WithoutGC(&local_10);
  return;
}

Assistant:

void SpecialRuntimeObjects::initialize()
{
    WithoutGC wgc(context);

    createSpecialObjectTable();
    createSpecialClassTable();
    registerGCRoots();
}